

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_statistics.h
# Opt level: O0

float highwayhash::MedianAbsoluteDeviation<float>
                (vector<float,_std::allocator<float>_> *samples,float median)

{
  bool bVar1;
  size_type __n;
  reference pfVar2;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *this;
  float fVar3;
  value_type_conflict2 local_60;
  float local_5c;
  const_iterator cStack_58;
  float sample;
  const_iterator __end0;
  const_iterator __begin0;
  vector<float,_std::allocator<float>_> *__range2;
  undefined1 local_30 [8];
  vector<float,_std::allocator<float>_> abs_deviations;
  float median_local;
  vector<float,_std::allocator<float>_> *samples_local;
  
  abs_deviations.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = median;
  bVar1 = std::vector<float,_std::allocator<float>_>::empty(samples);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!samples.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]highwayhash/highwayhash/robust_statistics.h"
                  ,0x7c,
                  "T highwayhash::MedianAbsoluteDeviation(const std::vector<T> &, const T) [T = float]"
                 );
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_30);
  __n = std::vector<float,_std::allocator<float>_>::size(samples);
  std::vector<float,_std::allocator<float>_>::reserve
            ((vector<float,_std::allocator<float>_> *)local_30,__n);
  __end0 = std::vector<float,_std::allocator<float>_>::begin(samples);
  cStack_58 = std::vector<float,_std::allocator<float>_>::end(samples);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffffa8);
    if (!bVar1) break;
    this = &__end0;
    pfVar2 = __gnu_cxx::
             __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(this);
    local_5c = *pfVar2;
    std::abs((int)this);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_30,&local_60);
    __gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
    operator++(&__end0);
  }
  fVar3 = Median<float>((vector<float,_std::allocator<float>_> *)local_30);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_30);
  return fVar3;
}

Assistant:

T MedianAbsoluteDeviation(const std::vector<T>& samples, const T median) {
  assert(!samples.empty());
  std::vector<T> abs_deviations;
  abs_deviations.reserve(samples.size());
  for (const T sample : samples) {
    abs_deviations.push_back(std::abs(sample - median));
  }
  return Median(&abs_deviations);
}